

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3_vfs_unregister(sqlite3_vfs *pVfs)

{
  bool bVar1;
  int iVar2;
  sqlite3_mutex *psVar3;
  
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    bVar1 = true;
    if ((sqlite3Config.bCoreMutex == 0) ||
       (psVar3 = (*sqlite3Config.mutex.xMutexAlloc)(2), psVar3 == (sqlite3_mutex *)0x0)) {
      psVar3 = (sqlite3_mutex *)0x0;
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(psVar3);
      bVar1 = false;
    }
    vfsUnlink(pVfs);
    if (!bVar1) {
      (*sqlite3Config.mutex.xMutexLeave)(psVar3);
    }
    return 0;
  }
  return iVar2;
}

Assistant:

SQLITE_API int sqlite3_vfs_unregister(sqlite3_vfs *pVfs){
  MUTEX_LOGIC(sqlite3_mutex *mutex;)
#ifndef SQLITE_OMIT_AUTOINIT
  int rc = sqlite3_initialize();
  if( rc ) return rc;
#endif
  MUTEX_LOGIC( mutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER); )
  sqlite3_mutex_enter(mutex);
  vfsUnlink(pVfs);
  sqlite3_mutex_leave(mutex);
  return SQLITE_OK;
}